

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O0

void fill_cache<4u>(Cacheblock<4U>_conflict *cache,size_t N,size_t depth)

{
  bool bVar1;
  ulong uVar2;
  uint local_34;
  CacheType c;
  CacheType ch;
  uint ci;
  uint si;
  size_t i;
  size_t depth_local;
  size_t N_local;
  Cacheblock<4U>_conflict *cache_local;
  
  _ci = 0;
  do {
    if (N <= _ci) {
      return;
    }
    ch = 0;
    c = 3;
    local_34 = 0;
    do {
      if (3 < c) break;
      uVar2 = (ulong)ch;
      local_34 = (uint)cache[_ci].ptr[depth + uVar2] << ((byte)(c << 3) & 0x1f) | local_34;
      c = c - 1;
      ch = ch + 1;
      bVar1 = is_end<unsigned_int>((uint)cache[_ci].ptr[depth + uVar2]);
    } while (!bVar1);
    cache[_ci].cached_bytes = local_34;
    _ci = _ci + 1;
  } while( true );
}

Assistant:

static void
fill_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	for (size_t i=0; i < N; ++i) {
		unsigned int j=0;
		while (j < CachedChars && cache[i].ptr[depth+j]) {
			cache[i].chars[j] = cache[i].ptr[depth+j];
			++j;
		}
		while (j < CachedChars) {
			cache[i].chars[j] = 0;
			++j;
		}
	}
}